

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O3

Own<kj::DatagramReceiver,_std::nullptr_t> __thiscall
kj::anon_unknown_0::DatagramPortImpl::makeReceiver(DatagramPortImpl *this,Capacity capacity)

{
  OwnedFileDescriptor OVar1;
  void *pvVar2;
  size_t in_RCX;
  size_t elementCount;
  DatagramReceiver *extraout_RDX;
  DatagramReceiver *extraout_RDX_00;
  DatagramReceiver *pDVar3;
  Own<kj::DatagramReceiver,_std::nullptr_t> OVar4;
  
  elementCount = capacity.ancillary;
  OVar1 = (OwnedFileDescriptor)operator_new(0x138);
  *(undefined ***)OVar1 = &PTR_receive_006e2618;
  *(size_t *)((long)OVar1 + 8) = capacity.content;
  pvVar2 = kj::_::HeapArrayDisposer::allocateImpl
                     (1,elementCount,elementCount,(_func_void_void_ptr *)0x0,
                      (_func_void_void_ptr *)0x0);
  *(void **)((long)OVar1 + 0x10) = pvVar2;
  *(size_t *)((long)OVar1 + 0x18) = elementCount;
  *(undefined8 **)((long)OVar1 + 0x20) = &kj::_::HeapArrayDisposer::instance;
  if (in_RCX == 0) {
    *(undefined8 *)((long)OVar1 + 0x28) = 0;
    *(undefined8 *)((long)OVar1 + 0x30) = 0;
    *(undefined8 *)((long)OVar1 + 0x38) = 0;
    pDVar3 = extraout_RDX;
  }
  else {
    pvVar2 = kj::_::HeapArrayDisposer::allocateImpl
                       (1,in_RCX,in_RCX,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    *(void **)((long)OVar1 + 0x28) = pvVar2;
    *(size_t *)((long)OVar1 + 0x30) = in_RCX;
    *(undefined8 **)((long)OVar1 + 0x38) = &kj::_::HeapArrayDisposer::instance;
    pDVar3 = extraout_RDX_00;
  }
  *(undefined8 *)((long)OVar1 + 0x40) = 0;
  *(undefined8 *)((long)OVar1 + 0x48) = 0;
  *(undefined8 *)((long)OVar1 + 0x50) = 0;
  *(undefined8 **)((long)OVar1 + 0x58) = &NullArrayDisposer::instance;
  *(undefined8 *)((long)OVar1 + 0x60) = 0;
  *(undefined2 *)((long)OVar1 + 0x68) = 0;
  *(undefined1 *)((long)OVar1 + 0x70) = 0;
  (this->super_DatagramPort)._vptr_DatagramPort =
       (_func_int **)
       &kj::_::HeapDisposer<kj::(anonymous_namespace)::DatagramPortImpl::ReceiverImpl>::instance;
  this->super_OwnedFileDescriptor = OVar1;
  OVar4.ptr = pDVar3;
  OVar4.disposer = (Disposer *)this;
  return OVar4;
}

Assistant:

Own<DatagramReceiver> DatagramPortImpl::makeReceiver(DatagramReceiver::Capacity capacity) {
  return kj::heap<ReceiverImpl>(*this, capacity);
}